

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLboolean parseVersionString(int *api,int *major,int *minor,int *rev)

{
  int iVar1;
  size_t __n;
  size_t length;
  char *prefixes [4];
  char *local_40;
  char *version;
  int i;
  int *rev_local;
  int *minor_local;
  int *major_local;
  int *api_local;
  
  prefixes[0] = "OpenGL ES-CL ";
  prefixes[1] = "OpenGL ES ";
  prefixes[2] = (char *)0x0;
  *api = 0x30001;
  local_40 = (char *)glGetString(0x1f02);
  if (local_40 == (char *)0x0) {
    _glfwInputError(0x10008,"Failed to retrieve context version string");
    api_local._7_1_ = '\0';
  }
  else {
    version._4_4_ = 0;
    while (prefixes[(long)version._4_4_ + -1] != (char *)0x0) {
      __n = strlen(prefixes[(long)version._4_4_ + -1]);
      iVar1 = strncmp(local_40,prefixes[(long)version._4_4_ + -1],__n);
      if (iVar1 == 0) {
        local_40 = local_40 + __n;
        *api = 0x30002;
        break;
      }
      version._4_4_ = version._4_4_ + 1;
    }
    iVar1 = __isoc99_sscanf(local_40,"%d.%d.%d",major,minor,rev);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"No version found in context version string");
      api_local._7_1_ = '\0';
    }
    else {
      api_local._7_1_ = '\x01';
    }
  }
  return api_local._7_1_;
}

Assistant:

static GLboolean parseVersionString(int* api, int* major, int* minor, int* rev)
{
    int i;
    const char* version;
    const char* prefixes[] =
    {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    *api = GLFW_OPENGL_API;

    version = (const char*) glGetString(GL_VERSION);
    if (!version)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Failed to retrieve context version string");
        return GL_FALSE;
    }

    for (i = 0;  prefixes[i];  i++)
    {
        const size_t length = strlen(prefixes[i]);

        if (strncmp(version, prefixes[i], length) == 0)
        {
            version += length;
            *api = GLFW_OPENGL_ES_API;
            break;
        }
    }

    if (!sscanf(version, "%d.%d.%d", major, minor, rev))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "No version found in context version string");
        return GL_FALSE;
    }

    return GL_TRUE;
}